

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O0

EdwardsPoint * ecc_edwards_point_new_imported(EdwardsCurve *ec,mp_int *monty_x,mp_int *monty_y)

{
  EdwardsPoint *pEVar1;
  mp_int *pmVar2;
  EdwardsPoint *ep;
  mp_int *monty_y_local;
  mp_int *monty_x_local;
  EdwardsCurve *ec_local;
  
  pEVar1 = ecc_edwards_point_new_empty(ec);
  pEVar1->X = monty_x;
  pEVar1->Y = monty_y;
  pmVar2 = monty_mul(ec->mc,pEVar1->X,pEVar1->Y);
  pEVar1->T = pmVar2;
  pmVar2 = monty_identity(ec->mc);
  pmVar2 = mp_copy(pmVar2);
  pEVar1->Z = pmVar2;
  return pEVar1;
}

Assistant:

static EdwardsPoint *ecc_edwards_point_new_imported(
    EdwardsCurve *ec, mp_int *monty_x, mp_int *monty_y)
{
    EdwardsPoint *ep = ecc_edwards_point_new_empty(ec);
    ep->X = monty_x;
    ep->Y = monty_y;
    ep->T = monty_mul(ec->mc, ep->X, ep->Y);
    ep->Z = mp_copy(monty_identity(ec->mc));
    return ep;
}